

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.cc
# Opt level: O2

void __thiscall gimage::View::setCamera(View *this,Camera *c)

{
  long lVar1;
  long lVar2;
  Camera *pCVar3;
  
  if (c == (Camera *)0x0) {
    if (this->camera != (Camera *)0x0) {
      (**(code **)(*(long *)this->camera + 8))();
    }
    this->camera = (Camera *)0x0;
  }
  else if ((*(long *)(c + 0x28) < 1) || (*(long *)(c + 0x30) < 1)) {
    if (this->camera != (Camera *)0x0) {
      (**(code **)(*(long *)this->camera + 8))();
    }
    pCVar3 = (Camera *)(**(code **)(*(long *)c + 0x10))(c);
    this->camera = pCVar3;
    lVar1 = (this->image).width;
    if ((0 < lVar1) && (lVar2 = (this->image).height, 0 < lVar2)) {
      *(long *)(pCVar3 + 0x28) = lVar1;
      *(long *)(pCVar3 + 0x30) = lVar2;
    }
    lVar1 = (this->depth).width;
    if ((0 < lVar1) && (lVar2 = (this->depth).height, 0 < lVar2)) {
      *(long *)(pCVar3 + 0x28) = lVar1;
      *(long *)(pCVar3 + 0x30) = lVar2;
    }
  }
  else {
    if (this->camera != (Camera *)0x0) {
      (**(code **)(*(long *)this->camera + 8))();
    }
    pCVar3 = (Camera *)(**(code **)(*(long *)c + 0x10))(c);
    this->camera = pCVar3;
  }
  return;
}

Assistant:

void View::setCamera(const gmath::Camera *c)
{
  if (c == 0)
  {
    delete camera;
    camera=0;
    return;
  }

  if (c->getWidth() > 0 && c->getHeight() > 0)
  {
    // make sure that the size of the camera is the same as the size of the
    // images

    if (image.getWidth() > 0 && image.getHeight() > 0)
    {
      assert(c->getWidth() == image.getWidth());
      assert(c->getHeight() == image.getHeight());
    }

    if (depth.getWidth() > 0 && depth.getHeight() > 0)
    {
      assert(c->getWidth() == depth.getWidth());
      assert(c->getHeight() == depth.getHeight());
    }

    delete camera;
    camera=c->clone();
  }
  else
  {
    delete camera;
    camera=c->clone();

    // set size of camera from images if neccessary

    if (image.getWidth() > 0 && image.getHeight() > 0)
    {
      camera->setSize(image.getWidth(), image.getHeight());
    }

    if (depth.getWidth() > 0 && depth.getHeight() > 0)
    {
      camera->setSize(depth.getWidth(), depth.getHeight());
    }
  }
}